

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroArgumentDefaultSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::syntax::MacroArgumentDefaultSyntax_const&>
          (BumpAllocator *this,MacroArgumentDefaultSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  MacroArgumentDefaultSyntax *pMVar8;
  
  pMVar8 = (MacroArgumentDefaultSyntax *)allocate(this,0x60,8);
  (pMVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pMVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pMVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pMVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->equals).field_0x2;
  NVar6.raw = (args->equals).numFlags.raw;
  uVar7 = (args->equals).rawLen;
  pIVar2 = (args->equals).info;
  (pMVar8->equals).kind = (args->equals).kind;
  (pMVar8->equals).field_0x2 = uVar5;
  (pMVar8->equals).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar8->equals).rawLen = uVar7;
  (pMVar8->equals).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->tokens).super_SyntaxListBase.super_SyntaxNode.parent;
  (pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->tokens).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pMVar8->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pMVar8->tokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (pMVar8->tokens).super_SyntaxListBase.childCount = (args->tokens).super_SyntaxListBase.childCount;
  sVar3 = (args->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pMVar8->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pMVar8->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pMVar8->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057ac88;
  return pMVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }